

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  byte bVar1;
  unsigned_long srcSize;
  unsigned_long srcSize_00;
  void *__n;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  FILE *__stream;
  size_type __n_00;
  size_t sVar6;
  int *piVar7;
  float ***pppfVar8;
  float **ppfVar9;
  int **ppiVar10;
  int *piVar11;
  float *pfVar12;
  size_t sVar13;
  char **ppcVar14;
  char *pcVar15;
  undefined4 uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  float fVar26;
  long lVar27;
  ulong uVar28;
  undefined8 uVar29;
  uchar *src;
  pointer paVar30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<float,_std::allocator<float>_> image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<int,_std::allocator<int>_> channelOffsetList;
  vector<char,_std::allocator<char>_> buf;
  uint local_164;
  allocator_type local_151;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  vector<int,_std::allocator<int>_> local_138;
  string local_120;
  size_t local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  pointer local_e0;
  string local_d8;
  size_type local_b8;
  int *local_b0;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_a8;
  size_t local_88;
  ulong local_80;
  long local_78;
  int *local_70;
  ulong local_68;
  void *local_60 [3];
  vector<char,_std::allocator<char>_> local_48;
  
  if (deepImage == (DeepImage *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar15 = "Invalid argument.";
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar15 = "Cannot read file.";
    }
    else {
      fseek(__stream,0,2);
      __n_00 = ftell(__stream);
      fseek(__stream,0,0);
      if (__n_00 != 0) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_48,__n_00,(allocator_type *)&local_120);
        sVar6 = fread(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,1,__n_00,__stream);
        if (sVar6 != __n_00) {
          __assert_fail("ret == filesize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x27eb,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        fclose(__stream);
        iVar17 = *(int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        if (iVar17 == 0x1312f76) {
          piVar11 = (int *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start + 4);
        }
        else {
          piVar11 = (int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
          if (err != (char **)0x0) {
            *err = "Header mismatch.";
          }
        }
        iVar22 = -3;
        if (iVar17 == 0x1312f76) {
          if (((((char)*piVar11 == '\x02') && (*(char *)((long)piVar11 + 1) == '\b')) &&
              (*(char *)((long)piVar11 + 2) == '\0')) && (*(char *)((long)piVar11 + 3) == '\0')) {
            local_b0 = (int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start;
            piVar11 = piVar11 + 1;
            local_a8.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_140 = CONCAT44(local_140._4_4_,1);
            iVar17 = -1;
            local_148 = 0xffffffff;
            local_150 = CONCAT44(local_150._4_4_,0xffffffff);
            local_100 = CONCAT44(local_100._4_4_,0xffffffff);
            local_164 = 0xffffffff;
            local_e0 = (pointer)CONCAT44(local_e0._4_4_,0xffffffff);
            do {
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              local_120._M_string_length = 0;
              local_120.field_2._M_local_buf[0] = '\0';
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              local_d8._M_string_length = 0;
              local_d8.field_2._M_local_buf[0] = '\0';
              uVar29 = 0;
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
              piVar7 = (int *)anon_unknown.dwarf_1096b8::ReadAttribute
                                        (&local_120,&local_d8,
                                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_138,(char *)piVar11);
              if (piVar7 == (int *)0x0) {
                piVar11 = (int *)((long)piVar11 + 1);
                iVar4 = 2;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_120);
                if (iVar4 == 0) {
                  bVar1 = (byte)*local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  if (bVar1 < 4) {
                    uVar16 = (int)local_140;
                    if (bVar1 == 3) {
                      uVar16 = 0x10;
                    }
                    local_140 = CONCAT44(local_140._4_4_,uVar16);
                    local_e0 = (pointer)CONCAT44(local_e0._4_4_,(uint)bVar1);
LAB_0014477e:
                    iVar4 = 0;
                    piVar11 = piVar7;
                  }
                  else {
                    iVar22 = -5;
                    iVar4 = 1;
                    if (err != (char **)0x0) {
                      pcVar15 = "Unsupported compression type.";
LAB_0014479d:
                      iVar4 = 1;
                      *err = pcVar15;
                    }
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_120);
                  if (iVar4 != 0) {
                    iVar4 = std::__cxx11::string::compare((char *)&local_120);
                    if (iVar4 == 0) {
                      uVar21 = (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start;
                      if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish !=
                          local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
                        if (uVar21 < 5) {
                          uVar29 = 4;
                        }
                        else if (uVar21 < 9) {
                          uVar29 = 8;
                        }
                        else {
                          if (0xc < uVar21) {
                            local_100 = CONCAT44(local_100._4_4_,
                                                 *local_138.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                            local_150 = CONCAT44(local_150._4_4_,
                                                 local_138.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[1]);
                            local_148 = (ulong)(uint)local_138.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start[2];
                            iVar17 = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start[3];
                            goto LAB_0014477e;
                          }
                          uVar29 = 0xc;
                        }
                      }
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar29);
LAB_00144f66:
                      uVar29 = 4;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_120);
                      if (iVar4 != 0) goto LAB_00144704;
                      uVar21 = (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start;
                      if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish !=
                          local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
                        if (uVar21 < 5) goto LAB_00144f66;
                        if (uVar21 < 9) {
                          uVar29 = 8;
                        }
                        else {
                          iVar4 = 0;
                          piVar11 = piVar7;
                          if (0xc < uVar21) goto LAB_001447a5;
                          uVar29 = 0xc;
                        }
                      }
                    }
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar29);
                    goto LAB_00144f8d;
                  }
                  anon_unknown.dwarf_1096b8::ReadChannelInfo
                            (&local_a8,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
                  local_164 = (int)((ulong)((long)local_a8.
                                                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_a8.
                                                 super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x55555555;
                  if ((int)local_164 < 1) {
                    iVar22 = -6;
                    iVar4 = 1;
                    if (err != (char **)0x0) {
                      pcVar15 = "Invalid channels format.";
                      goto LAB_0014479d;
                    }
                  }
                  else {
LAB_00144704:
                    iVar4 = 0;
                    piVar11 = piVar7;
                  }
                }
              }
LAB_001447a5:
              if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p);
              }
            } while (iVar4 == 0);
            if (iVar4 == 2) {
              if ((int)local_100 < 0) {
LAB_00144f8d:
                __assert_fail("dx >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                              ,0x2865,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if ((int)local_150 < 0) {
                __assert_fail("dy >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                              ,0x2866,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if ((int)local_148 < 0) {
                __assert_fail("dw >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                              ,0x2867,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if (iVar17 < 0) {
                __assert_fail("dh >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                              ,0x2868,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if ((int)local_164 < 1) {
                __assert_fail("numChannels >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                              ,0x2869,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              uVar5 = (int)local_148 - (int)local_100;
              local_148 = (ulong)uVar5;
              uVar5 = uVar5 + 1;
              iVar17 = iVar17 - (int)local_150;
              uVar23 = iVar17 + 1;
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_120,
                         (long)(int)(uVar23 * uVar5 * 4),(allocator_type *)&local_d8);
              uVar24 = (uint)((int)local_140 * ((int)uVar23 / (int)local_140) <= iVar17) +
                       (int)uVar23 / (int)local_140;
              std::vector<long_long,_std::allocator<long_long>_>::vector
                        ((vector<long_long,_std::allocator<long_long>_> *)&local_d8,
                         (long)(int)uVar24,(allocator_type *)&local_138);
              if (0 < (int)uVar24) {
                uVar21 = 0;
                do {
                  *(undefined8 *)(local_d8._M_dataplus._M_p + uVar21 * 8) =
                       *(undefined8 *)(piVar11 + uVar21 * 2);
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              if (((uint)local_e0 < 4) && ((uint)local_e0 != 1)) {
                local_68 = (ulong)local_164;
                local_88 = local_68 * 8;
                local_150 = (ulong)uVar5;
                pppfVar8 = (float ***)malloc(local_88);
                deepImage->image = pppfVar8;
                uVar21 = 1;
                if (1 < (int)local_164) {
                  uVar21 = (ulong)local_164;
                }
                uVar28 = 0;
                do {
                  ppfVar9 = (float **)malloc((long)(int)uVar23 << 3);
                  deepImage->image[uVar28] = ppfVar9;
                  uVar28 = uVar28 + 1;
                } while (uVar21 != uVar28);
                ppiVar10 = (int **)malloc((long)(int)uVar23 << 3);
                deepImage->offset_table = ppiVar10;
                local_b8 = (size_type)(int)local_150;
                if (-1 < iVar17) {
                  sVar6 = local_b8 * 4;
                  uVar21 = 0;
                  do {
                    piVar11 = (int *)malloc(sVar6);
                    deepImage->offset_table[uVar21] = piVar11;
                    uVar21 = uVar21 + 1;
                  } while (uVar23 != uVar21);
                }
                if (0 < (int)uVar24) {
                  local_78 = (long)(int)local_148;
                  local_140 = 1;
                  if (1 < (int)local_164) {
                    local_140 = (ulong)local_164;
                  }
                  local_e0 = local_a8.
                             super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_70 = &(local_a8.
                               super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start)->pixelType;
                  uVar21 = 0;
                  piVar11 = local_b0;
                  local_80 = (ulong)uVar24;
                  do {
                    lVar19 = *(long *)(local_d8._M_dataplus._M_p + uVar21 * 8);
                    srcSize = *(unsigned_long *)((long)piVar11 + lVar19 + 4);
                    srcSize_00 = *(unsigned_long *)((long)piVar11 + lVar19 + 0xc);
                    __n = *(void **)((long)piVar11 + lVar19 + 0x14);
                    std::vector<int,_std::allocator<int>_>::vector
                              (&local_138,local_b8,(allocator_type *)&local_f8);
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                    if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start == (uchar *)0x0) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
LAB_00144ed0:
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
LAB_00144ee2:
                      __assert_fail("dstLen == (unsigned long)unpackedSampleDataSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                                    ,0x28c5,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    src = (uchar *)((long)piVar11 + lVar19 + 0x1c);
                    anon_unknown.dwarf_1096b8::DecompressZip
                              ((uchar *)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                               (unsigned_long *)&local_f8,src,srcSize);
                    if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start !=
                        (uchar *)((long)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start)) {
                      __assert_fail("dstLen == pixelOffsetTable.size() * sizeof(int)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                                    ,0x28b7,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    if (-1 < (int)local_148) {
                      piVar11 = deepImage->offset_table[uVar21];
                      uVar28 = 0;
                      do {
                        piVar11[uVar28] =
                             local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (local_150 != uVar28);
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&local_f8,(size_type)__n,(allocator_type *)local_60);
                    local_60[0] = __n;
                    if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) goto LAB_00144ed0;
                    anon_unknown.dwarf_1096b8::DecompressZip
                              (local_f8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)local_60,
                               src + srcSize,srcSize_00);
                    if (local_60[0] != __n) goto LAB_00144ee2;
                    std::vector<int,_std::allocator<int>_>::vector
                              ((vector<int,_std::allocator<int>_> *)local_60,local_68,&local_151);
                    uVar28 = 0;
                    uVar18 = 0;
                    piVar11 = local_70;
                    do {
                      *(int *)((long)local_60[0] + uVar28 * 4) = (int)uVar18;
                      if (2 < (ulong)(uint)*piVar11) {
LAB_00144e5f:
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                                      ,0x28d6,
                                      "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                      }
                      uVar18 = (long)(int)uVar18 +
                               (long)*(int *)(&DAT_001e3628 + (ulong)(uint)*piVar11 * 4);
                      uVar28 = uVar28 + 1;
                      piVar11 = piVar11 + 0xc;
                    } while (local_140 != uVar28);
                    if ((int)uVar18 < 2) {
                      __assert_fail("sampleSize >= 2",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                                    ,0x28db,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    if ((long)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start !=
                        (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[local_78] * uVar18) {
                      __assert_fail("(size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size()"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                                    ,0x28dd,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = uVar18 & 0xffffffff;
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = (long)local_f8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_f8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                    lVar19 = SUB168(auVar3 / auVar2,0) << 0x20;
                    sVar6 = lVar19 >> 0x1e;
                    local_100 = lVar19 >> 0x1f;
                    iVar17 = SUB164(auVar3 / auVar2,0);
                    lVar19 = (long)iVar17;
                    uVar28 = 0;
                    uVar18 = 0;
                    do {
                      pfVar12 = (float *)malloc(sVar6);
                      deepImage->image[uVar28][uVar21] = pfVar12;
                      sVar13 = sVar6;
                      if (local_e0[uVar28].pixelType == 0) {
                        if (0 < iVar17) {
                          lVar20 = 0;
                          lVar27 = 0;
                          do {
                            if ((ulong)((long)local_f8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_f8.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start) <=
                                uVar18 + lVar20) goto LAB_00144e51;
                            *(float *)((long)deepImage->image[uVar28][uVar21] + lVar20) =
                                 (float)*(uint *)(local_f8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar20 + uVar18);
                            lVar27 = lVar27 + 1;
                            lVar20 = lVar20 + 4;
                          } while (lVar27 < lVar19);
                        }
                      }
                      else if (local_e0[uVar28].pixelType == 1) {
                        sVar13 = local_100;
                        if (0 < iVar17) {
                          lVar20 = 0;
                          lVar27 = 0;
                          uVar25 = uVar18;
                          do {
                            if ((ulong)((long)local_f8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_f8.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start) <= uVar25) {
                              std::__throw_out_of_range_fmt
                                        (
                                        "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                        );
LAB_00144e43:
                              std::__throw_out_of_range_fmt
                                        (
                                        "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                        );
LAB_00144e51:
                              std::__throw_out_of_range_fmt
                                        (
                                        "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                        );
                              goto LAB_00144e5f;
                            }
                            uVar5 = (uint)*(ushort *)
                                           (local_f8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar25) <<
                                    0xd;
                            if ((uVar5 & 0xf800000) == 0xf800000) {
                              fVar26 = (float)(uVar5 | 0x70000000);
                            }
                            else if ((uVar5 & 0xf800000) == 0) {
                              fVar26 = (float)(uVar5 | 0x38800000) + -6.1035156e-05;
                            }
                            else {
                              fVar26 = (float)((uVar5 & 0xfffe000) + 0x38000000);
                            }
                            *(uint *)((long)deepImage->image[uVar28][uVar21] + lVar20) =
                                 (int)(short)*(ushort *)
                                              (local_f8.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start + uVar25) &
                                 0x80000000U | (uint)fVar26;
                            lVar27 = lVar27 + 1;
                            lVar20 = lVar20 + 4;
                            uVar25 = uVar25 + 2;
                          } while (lVar27 < lVar19);
                        }
                      }
                      else if (0 < iVar17) {
                        lVar20 = 0;
                        lVar27 = 0;
                        do {
                          if ((ulong)((long)local_f8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_f8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start) <=
                              uVar18 + lVar20) goto LAB_00144e43;
                          *(undefined4 *)((long)deepImage->image[uVar28][uVar21] + lVar20) =
                               *(undefined4 *)
                                (local_f8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar20 + uVar18);
                          lVar27 = lVar27 + 1;
                          lVar20 = lVar20 + 4;
                        } while (lVar27 < lVar19);
                      }
                      uVar18 = uVar18 + sVar13;
                      uVar28 = uVar28 + 1;
                    } while (uVar28 != local_140);
                    if (local_60[0] != (void *)0x0) {
                      operator_delete(local_60[0]);
                    }
                    uVar28 = local_80;
                    piVar11 = local_b0;
                    if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (uchar *)0x0) {
                      operator_delete(local_f8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar28);
                }
                deepImage->width = (int)local_150;
                deepImage->height = uVar23;
                ppcVar14 = (char **)malloc(local_88);
                deepImage->channel_names = ppcVar14;
                uVar21 = 1;
                if (1 < (int)local_164) {
                  uVar21 = (ulong)local_164;
                }
                uVar28 = 0;
                paVar30 = local_a8.
                          super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  pcVar15 = strdup((paVar30->name)._M_dataplus._M_p);
                  deepImage->channel_names[uVar28] = pcVar15;
                  uVar28 = uVar28 + 1;
                  paVar30 = paVar30 + 1;
                } while (uVar21 != uVar28);
                deepImage->num_channels = local_164;
                iVar22 = 0;
              }
              else {
                iVar22 = -10;
                if (err != (char **)0x0) {
                  *err = "Unsupported format.";
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_d8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_120._M_dataplus._M_p);
              }
            }
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::~vector(&local_a8);
          }
          else {
            iVar22 = -4;
            if (err != (char **)0x0) {
              *err = "Unsupported version or scanline.";
            }
          }
        }
        if ((int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start == (int *)0x0) {
          return iVar22;
        }
        operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        return iVar22;
      }
      fclose(__stream);
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar15 = "File size is zero.";
    }
  }
  *err = pcVar15;
  return -1;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}